

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,ReadStream *r)

{
  Expression *pEVar1;
  char *s;
  CodePrinter *pCVar2;
  InputDeclaration *pIVar3;
  string *s_00;
  ReadStream *r_local;
  PrinterStream *this_local;
  
  pCVar2 = this->out;
  pEVar1 = pool_ptr<soul::heart::Expression>::operator*(&(r->super_Assignment).target);
  s = getAssignmentRole(this,pEVar1);
  choc::text::CodePrinter::operator<<(pCVar2,s);
  pEVar1 = pool_ptr<soul::heart::Expression>::operator*(&(r->super_Assignment).target);
  printExpression(this,pEVar1);
  pCVar2 = choc::text::CodePrinter::operator<<(this->out," = read ");
  pIVar3 = pool_ref<soul::heart::InputDeclaration>::operator->(&r->source);
  s_00 = Identifier::toString_abi_cxx11_(&(pIVar3->super_IODeclaration).name);
  choc::text::CodePrinter::operator<<(pCVar2,s_00);
  return;
}

Assistant:

void printDescription (const heart::ReadStream& r)
        {
            out << getAssignmentRole (*r.target);
            printExpression (*r.target);
            out << " = read " << r.source->name.toString();
        }